

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<int>_> * __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<int>_> *this,
          linked_ptr<const_testing::MatcherInterface<int>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<int>const>::copy<testing::MatcherInterface<int>const>
              ((linked_ptr<testing::MatcherInterface<int>const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }